

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O2

bool anon_unknown.dwarf_1498d::SolverDpllTriadSimd<0>::InitVanillaByBand(char *input,State *state)

{
  long lVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int pos;
  ulong uVar5;
  bool bVar6;
  undefined8 in_RAX;
  uint uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  
  auVar10[8] = 0x2e;
  auVar10._0_8_ = 0x2e2e2e2e2e2e2e2e;
  auVar10[9] = 0x2e;
  auVar10[10] = 0x2e;
  auVar10[0xb] = 0x2e;
  auVar10[0xc] = 0x2e;
  auVar10[0xd] = 0x2e;
  auVar10[0xe] = 0x2e;
  auVar10[0xf] = 0x2e;
  auVar10[0x10] = 0x2e;
  auVar10[0x11] = 0x2e;
  auVar10[0x12] = 0x2e;
  auVar10[0x13] = 0x2e;
  auVar10[0x14] = 0x2e;
  auVar10[0x15] = 0x2e;
  auVar10[0x16] = 0x2e;
  auVar10[0x17] = 0x2e;
  auVar10[0x18] = 0x2e;
  auVar10[0x19] = 0x2e;
  auVar10[0x1a] = 0x2e;
  auVar10[0x1b] = 0x2e;
  auVar10[0x1c] = 0x2e;
  auVar10[0x1d] = 0x2e;
  auVar10[0x1e] = 0x2e;
  auVar10[0x1f] = 0x2e;
  lVar1 = vpcmpeqb_avx512vl(auVar10,*(undefined1 (*) [32])(input + 0x20));
  uVar2 = vpcmpeqb_avx512vl(auVar10,*(undefined1 (*) [32])input);
  for (uVar8 = ~(lVar1 << 0x20 | CONCAT44((int)((ulong)in_RAX >> 0x20),(int)uVar2)); uVar8 != 0;
      uVar8 = uVar8 - 1 & uVar8) {
    pos = 0;
    for (uVar5 = uVar8; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
      pos = pos + 1;
    }
    InitClue(input,state,pos);
  }
  auVar9[8] = 0x2e;
  auVar9._0_8_ = 0x2e2e2e2e2e2e2e2e;
  auVar9[9] = 0x2e;
  auVar9[10] = 0x2e;
  auVar9[0xb] = 0x2e;
  auVar9[0xc] = 0x2e;
  auVar9[0xd] = 0x2e;
  auVar9[0xe] = 0x2e;
  auVar9[0xf] = 0x2e;
  uVar8 = vpcmpb_avx512vl(auVar9,*(undefined1 (*) [16])(input + 0x40),4);
  while (uVar7 = (uint)uVar8, uVar7 != 0) {
    uVar3 = 0;
    for (uVar4 = uVar7; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
      uVar3 = uVar3 + 1;
    }
    InitClue(input,state,uVar3 | 0x40);
    uVar8 = (ulong)(uVar7 - 1 & uVar7);
  }
  if (input[0x50] != '.') {
    InitClue(input,state,0x50);
  }
  bVar6 = BandEliminate<0>(state,0,1);
  if (bVar6) {
    bVar6 = BandEliminate<1>(state,0,1);
    if (bVar6) {
      bVar6 = BandEliminate<0>(state,1,2);
      if (bVar6) {
        bVar6 = BandEliminate<1>(state,1,2);
        if (bVar6) {
          bVar6 = BandEliminate<0>(state,2,0);
          if (bVar6) {
            bVar6 = BandEliminate<1>(state,2,0);
            return bVar6;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool InitVanillaByBand(const char *input, State &state) {
        uint64_t clues64 = WhichDots64(input) ^ (uint64_t)-1ll;
        while (clues64) {
            int cell_idx = LowOrderBitIndex64(clues64);
            InitClue(input, state, cell_idx);
            clues64 = ClearLowBit64(clues64);
        }
        uint32_t clues16 = WhichDots16(input + 64) ^ 0xffffu;
        while (clues16) {
            int cell_idx = 64 + LowOrderBitIndex(clues16);
            InitClue(input, state, cell_idx);
            clues16 = ClearLowBit(clues16);
        }
        if (input[80] != '.') {
            InitClue(input, state, 80);
        }
        // thanks to the merging of band updates the puzzle is almost always fully initialized
        // after the first of these calls. most will be no-ops, but we've still got to do them
        // since this cannot be guaranteed.
        return BandEliminate<0>(state, 0, 1) && BandEliminate<1>(state, 0, 1) &&
               BandEliminate<0>(state, 1, 2) && BandEliminate<1>(state, 1, 2) &&
               BandEliminate<0>(state, 2, 0) && BandEliminate<1>(state, 2, 0);
    }